

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::iterateMulti(HEkkDual *this)

{
  long in_RDI;
  HEkkDual *in_stack_00000020;
  HEkkDual *in_stack_00000050;
  HEkkDual *in_stack_00000060;
  HVector *in_stack_00000068;
  HEkkDual *in_stack_00000070;
  HEkkDual *in_stack_000000c0;
  HVector *in_stack_00000148;
  HEkkDual *in_stack_00000150;
  
  *(undefined4 *)(in_RDI + 0x800) = 1;
  majorChooseRow(in_stack_000000c0);
  minorChooseRow(in_stack_00000050);
  if (*(int *)(in_RDI + 0x7b0) == -1) {
    *(undefined4 *)(in_RDI + 0xe8) = 3;
  }
  else {
    if (((double)*(int *)(*(long *)(in_RDI + (long)*(int *)(in_RDI + 0x14cc) * 0x78 + 0x2778) + 4) *
        1.0) / (double)*(int *)(in_RDI + 0x18) < 0.01) {
      *(undefined4 *)(in_RDI + 0x800) = 0;
    }
    if (*(int *)(in_RDI + 0x800) == 0) {
      chooseColumn(in_stack_00000150,in_stack_00000148);
    }
    else {
      chooseColumnSlice(in_stack_00000070,in_stack_00000068);
    }
    if (*(int *)(in_RDI + 0xe8) == 0) {
      minorUpdate(in_stack_00000020);
      majorUpdate(in_stack_00000060);
    }
    else if (*(int *)(in_RDI + 0x14cc) == 0) {
      highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kWarning,
                  "PAMI skipping majorUpdate() due to multi_nFinish = %d; rebuild_reason = %d\n",
                  (ulong)*(uint *)(in_RDI + 0x14cc),(ulong)*(uint *)(in_RDI + 0xe8));
    }
    else {
      majorUpdate(in_stack_00000060);
    }
  }
  return;
}

Assistant:

void HEkkDual::iterateMulti() {
  slice_PRICE = 1;

  // Report candidate
  majorChooseRow();
  minorChooseRow();
  if (row_out == kNoRowChosen) {
    rebuild_reason = kRebuildReasonPossiblyOptimal;
    return;
  }

  // Assign the slice_row_ep, skip if possible
  if (1.0 * multi_finish[multi_nFinish].row_ep->count / solver_num_row < 0.01)
    slice_PRICE = 0;

  if (slice_PRICE) {
    // #pragma omp parallel
    // #pragma omp single
    chooseColumnSlice(multi_finish[multi_nFinish].row_ep);
  } else {
    chooseColumn(multi_finish[multi_nFinish].row_ep);
  }
  // If we failed.
  if (rebuild_reason) {
    if (multi_nFinish) {
      majorUpdate();
    } else {
      highsLogDev(
          ekk_instance_.options_->log_options, HighsLogType::kWarning,
          "PAMI skipping majorUpdate() due to multi_nFinish = %" HIGHSINT_FORMAT
          "; "
          "rebuild_reason = %" HIGHSINT_FORMAT "\n",
          multi_nFinish, rebuild_reason);
    }
    return;
  }

  minorUpdate();
  majorUpdate();
}